

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,FragmentTextureWorkloadCullCase *this)

{
  allocator<char> local_119;
  string local_118;
  string local_f8;
  ProgramSources local_d8;
  
  (anonymous_namespace)::Utils::getBaseVertexShader_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nuniform mediump int u_iterations;\nuniform sampler2D u_texture;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tfor (int i = 0; i<u_iterations; i++)\n\t\td *= texture(u_texture, (gl_FragCoord.xy+vec2(i))/512.0).r;\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(1,1,1,1);\n\telse\n\t\tfragColor = vec4(d,0,0,1);\n}\n"
             ,&local_119);
  glu::makeVtxFragSources(&local_d8,&local_118,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  Utils::getFullscreenQuad((vector<float,_std::allocator<float>_> *)&local_118,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_d8,(Geometry *)&local_118);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_118);
  glu::ProgramSources::~ProgramSources(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry					(void) const
	{
		return ObjectData(Utils::getTextureWorkloadShader(), Utils::getFullscreenQuad(0.8f));
	}